

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O0

void __thiscall
QTextBoundaryFinder::QTextBoundaryFinder
          (QTextBoundaryFinder *this,BoundaryType type,QStringView string,uchar *buffer,
          qsizetype bufferSize)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  void *pvVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  uint *in_RDI;
  long in_R8;
  long in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_ESI;
  QString::QString((QString *)0x54f201);
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  *(undefined8 *)(in_RDI + 10) = in_RCX;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = in_RDI[0xe] & 0xfffffffe | 1;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  bVar2 = QStringView::isEmpty((QStringView *)0x54f23d);
  if (!bVar2) {
    if ((in_R8 == 0) ||
       (qVar3 = QStringView::size((QStringView *)(in_RDI + 8)), in_R9 / 1 < qVar3 + 1)) {
      qVar3 = QStringView::size((QStringView *)(in_RDI + 8));
      pvVar4 = malloc(qVar3 + 1);
      *(void **)(in_RDI + 0x10) = pvVar4;
      if (*(long *)(in_RDI + 0x10) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          qBadAlloc();
        }
        goto LAB_0054f378;
      }
    }
    else {
      *(long *)(in_RDI + 0x10) = in_R8;
      in_RDI[0xe] = in_RDI[0xe] & 0xfffffffe;
    }
    ::init((EVP_PKEY_CTX *)(ulong)*in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0054f378:
  __stack_chk_fail();
}

Assistant:

QTextBoundaryFinder::QTextBoundaryFinder(BoundaryType type, QStringView string, unsigned char *buffer, qsizetype bufferSize)
    : t(type)
    , sv(string)
    , freeBuffer(true)
{
    if (!sv.isEmpty()) {
        if (buffer && bufferSize / int(sizeof(QCharAttributes)) >= sv.size() + 1) {
            attributes = reinterpret_cast<QCharAttributes *>(buffer);
            freeBuffer = false;
        } else {
            attributes = (QCharAttributes *) malloc((sv.size() + 1) * sizeof(QCharAttributes));
            Q_CHECK_PTR(attributes);
        }
        init(t, sv, attributes);
    }
}